

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

bool __thiscall Cache::isPolicyValid(Cache *this)

{
  bool bVar1;
  Cache *in_RDI;
  bool local_1;
  
  bVar1 = isPowerOfTwo(in_RDI,(in_RDI->policy).cacheSize);
  if (bVar1) {
    bVar1 = isPowerOfTwo(in_RDI,(in_RDI->policy).blockSize);
    if (bVar1) {
      if ((in_RDI->policy).cacheSize % (in_RDI->policy).blockSize == 0) {
        if ((in_RDI->policy).blockNum * (in_RDI->policy).blockSize == (in_RDI->policy).cacheSize) {
          if ((in_RDI->policy).blockNum % (in_RDI->policy).associativity == 0) {
            local_1 = true;
          }
          else {
            fprintf(_stderr,"blockNum %% associativity != 0\n");
            local_1 = false;
          }
        }
        else {
          fprintf(_stderr,"blockNum * blockSize != cacheSize\n");
          local_1 = false;
        }
      }
      else {
        fprintf(_stderr,"cacheSize %% blockSize != 0\n");
        local_1 = false;
      }
    }
    else {
      fprintf(_stderr,"Invalid Block Size %d\n",(ulong)(in_RDI->policy).blockSize);
      local_1 = false;
    }
  }
  else {
    fprintf(_stderr,"Invalid Cache Size %d\n",(ulong)(in_RDI->policy).cacheSize);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Cache::isPolicyValid() {
  if (!this->isPowerOfTwo(policy.cacheSize)) {
    fprintf(stderr, "Invalid Cache Size %d\n", policy.cacheSize);
    return false;
  }
  if (!this->isPowerOfTwo(policy.blockSize)) {
    fprintf(stderr, "Invalid Block Size %d\n", policy.blockSize);
    return false;
  }
  if (policy.cacheSize % policy.blockSize != 0) {
    fprintf(stderr, "cacheSize %% blockSize != 0\n");
    return false;
  }
  if (policy.blockNum * policy.blockSize != policy.cacheSize) {
    fprintf(stderr, "blockNum * blockSize != cacheSize\n");
    return false;
  }
  if (policy.blockNum % policy.associativity != 0) {
    fprintf(stderr, "blockNum %% associativity != 0\n");
    return false;
  }
  return true;
}